

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

bool __thiscall Fossilize::ApplicationInfoFilter::Impl::parse(Impl *this,char *path)

{
  bool bVar1;
  char *str;
  size_type length;
  Value *pVVar2;
  Value *default_feature_variants;
  Value *default_variants;
  Value *filters;
  Value *blacklist;
  undefined1 local_c0 [4];
  int json_int;
  string json_str;
  undefined1 local_98 [8];
  Document doc;
  vector<char,_std::allocator<char>_> buffer;
  char *path_local;
  Impl *this_local;
  
  read_file((vector<char,_std::allocator<char>_> *)&doc.parseResult_.offset_,path);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)local_98,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  str = std::vector<char,_std::allocator<char>_>::data
                  ((vector<char,_std::allocator<char>_> *)&doc.parseResult_.offset_);
  length = std::vector<char,_std::allocator<char>_>::size
                     ((vector<char,_std::allocator<char>_> *)&doc.parseResult_.offset_);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Parse((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           *)local_98,str,length);
  bVar1 = rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::HasParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                           *)local_98);
  if (bVar1) {
    this_local._7_1_ = false;
    json_str.field_2._12_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)local_c0);
    bVar1 = get_safe_member_string((Value *)local_98,"asset",(string *)local_c0);
    if ((!bVar1) ||
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c0,"FossilizeApplicationInfoFilter"), bVar1)) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = get_safe_member_int((Value *)local_98,"version",(int *)((long)&blacklist + 4));
      if ((bVar1) && (blacklist._4_4_ < 3)) {
        pVVar2 = maybe_get_member((Value *)local_98,"blacklistedApplicationNames");
        if ((pVVar2 == (Value *)0x0) ||
           (bVar1 = add_blacklists(&this->blacklisted_application_names,pVVar2), bVar1)) {
          pVVar2 = maybe_get_member((Value *)local_98,"blacklistedEngineNames");
          if ((pVVar2 == (Value *)0x0) ||
             (bVar1 = add_blacklists(&this->blacklisted_engine_names,pVVar2), bVar1)) {
            pVVar2 = maybe_get_member((Value *)local_98,"applicationFilters");
            if ((pVVar2 == (Value *)0x0) ||
               (bVar1 = add_application_filters(&this->application_infos,pVVar2), bVar1)) {
              pVVar2 = maybe_get_member((Value *)local_98,"engineFilters");
              if ((pVVar2 == (Value *)0x0) ||
                 (bVar1 = add_application_filters(&this->engine_infos,pVVar2), bVar1)) {
                pVVar2 = maybe_get_member((Value *)local_98,"defaultBucketVariantDependencies");
                if ((pVVar2 == (Value *)0x0) ||
                   (bVar1 = parse_bucket_variant_dependencies
                                      (pVVar2,&this->default_variant_dependencies), bVar1)) {
                  pVVar2 = maybe_get_member((Value *)local_98,
                                            "defaultBucketVariantFeatureDependencies");
                  if ((pVVar2 == (Value *)0x0) ||
                     (bVar1 = parse_bucket_variant_dependencies
                                        (pVVar2,&this->default_variant_dependencies_feature), bVar1)
                     ) {
                    this_local._7_1_ = true;
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    json_str.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_c0);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)local_98);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)&doc.parseResult_.offset_);
  return this_local._7_1_;
}

Assistant:

bool ApplicationInfoFilter::Impl::parse(const char *path)
{
	auto buffer = read_file(path);

	Document doc;
	doc.Parse(buffer.data(), buffer.size());
	if (doc.HasParseError())
		return false;

	std::string json_str;
	int json_int;

	if (!get_safe_member_string(doc, "asset", json_str) || json_str != "FossilizeApplicationInfoFilter")
		return false;

	if (!get_safe_member_int(doc, "version", json_int) || json_int > FOSSILIZE_APPLICATION_INFO_FILTER_VERSION)
		return false;

	auto *blacklist = maybe_get_member(doc, "blacklistedApplicationNames");
	if (blacklist)
		if (!add_blacklists(blacklisted_application_names, blacklist))
			return false;
	blacklist = maybe_get_member(doc, "blacklistedEngineNames");
	if (blacklist)
		if (!add_blacklists(blacklisted_engine_names, blacklist))
			return false;

	auto *filters = maybe_get_member(doc, "applicationFilters");
	if (filters)
		if (!add_application_filters(application_infos, filters))
			return false;
	filters = maybe_get_member(doc, "engineFilters");
	if (filters)
		if (!add_application_filters(engine_infos, filters))
			return false;

	auto *default_variants = maybe_get_member(doc, "defaultBucketVariantDependencies");
	if (default_variants)
		if (!parse_bucket_variant_dependencies(*default_variants, default_variant_dependencies))
			return false;

	auto *default_feature_variants = maybe_get_member(doc, "defaultBucketVariantFeatureDependencies");
	if (default_feature_variants)
		if (!parse_bucket_variant_dependencies(*default_feature_variants, default_variant_dependencies_feature))
			return false;

	return true;
}